

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O1

void __thiscall
Printer_prettyPrintSpacesNewlines_Test::TestBody(Printer_prettyPrintSpacesNewlines_Test *this)

{
  string *psVar1;
  char cVar2;
  char *pcVar3;
  string equation1;
  ComponentPtr component1;
  AssertionResult gtest_ar;
  ModelPtr model;
  PrinterPtr printer;
  AssertHelper aAStack_98 [8];
  long *local_90 [2];
  long local_80 [2];
  string *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  internal local_40 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  string *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  bool local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  libcellml::Printer::create();
  libcellml::Model::create();
  psVar1 = local_30;
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"model","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"component","");
  libcellml::Component::create((string *)&local_70);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  libcellml::ComponentEntity::addComponent((shared_ptr *)local_30);
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,
             "  <apply><eq/>\n    <apply><diff/>\n      <bvar><ci>t</ci></bvar>\n      <ci>X</ci>\n    </apply>\n    <apply><minus/>\n      <apply><times/>\n        <ci>alpha_X</ci>\n        <apply><minus/>\n          <cn cellml:units=\"dimensionless\">1</cn>\n          <ci>X</ci>\n        </apply>\n      </apply>\n      <apply><times/>\n        <ci>beta_X</ci>\n        <ci>X</ci>\n      </apply>\n    </apply>\n  </apply>\n"
             ,"");
  libcellml::Component::setMath(local_70);
  libcellml::Component::appendMath(local_70);
  libcellml::Component::appendMath(local_70);
  libcellml::Printer::printModel_abi_cxx11_((shared_ptr *)&local_60,local_20);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_40,"PRETTY_MODEL_STRING","printer->printModel(model)",
             &PRETTY_MODEL_STRING_abi_cxx11_,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (aAStack_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/printer/printer.cpp"
               ,0x34a,pcVar3);
    testing::internal::AssertHelper::operator=(aAStack_98,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(aAStack_98);
    if ((long *)local_60._M_dataplus._M_p != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && ((long *)local_60._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
      }
      local_60._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  return;
}

Assistant:

TEST(Printer, prettyPrintSpacesNewlines)
{
    auto printer = libcellml::Printer::create();
    auto model = libcellml::Model::create();
    model->setName("model");

    auto component1 = libcellml::Component::create("component");
    model->addComponent(component1);
    const std::string equation1 =
        "  <apply><eq/>\n"
        "    <apply><diff/>\n"
        "      <bvar><ci>t</ci></bvar>\n"
        "      <ci>X</ci>\n"
        "    </apply>\n"
        "    <apply><minus/>\n"
        "      <apply><times/>\n"
        "        <ci>alpha_X</ci>\n"
        "        <apply><minus/>\n"
        "          <cn cellml:units=\"dimensionless\">1</cn>\n"
        "          <ci>X</ci>\n"
        "        </apply>\n"
        "      </apply>\n"
        "      <apply><times/>\n"
        "        <ci>beta_X</ci>\n"
        "        <ci>X</ci>\n"
        "      </apply>\n"
        "    </apply>\n"
        "  </apply>\n";
    component1->setMath(MATH_HEADER);
    component1->appendMath(equation1);
    component1->appendMath(MATH_FOOTER);

    EXPECT_EQ(PRETTY_MODEL_STRING, printer->printModel(model));
}